

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

void add_csc_range_penalty<PredictionData<double,int>>
               (WorkerForPredictCSC *workspace,PredictionData<double,_int> *prediction_data,
               double *weights_arr,size_t col_num,double range_low,double range_high)

{
  pointer puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  pointer pdVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong *puVar9;
  pointer puVar10;
  long lVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  size_t row;
  size_t sVar15;
  long lVar16;
  pointer puVar17;
  ulong uVar18;
  int *piVar19;
  int *piVar20;
  ulong uVar21;
  double dVar22;
  
  puVar17 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar15 = workspace->st;
  puVar1 = puVar17 + sVar15;
  uVar8 = workspace->end;
  puVar10 = puVar17 + uVar8 + 1;
  if (puVar1 != puVar10) {
    uVar8 = (long)puVar10 - (long)puVar1 >> 3;
    lVar11 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar10,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar10);
    puVar17 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar15 = workspace->st;
    uVar8 = workspace->end;
  }
  piVar4 = prediction_data->Xc_ind;
  lVar16 = (long)prediction_data->Xc_indptr[col_num];
  lVar11 = (long)prediction_data->Xc_indptr[col_num + 1];
  puVar9 = puVar17 + sVar15;
  puVar12 = puVar17 + uVar8 + 1;
  uVar14 = (long)puVar12 - (long)puVar9 >> 3;
  if (0 < (long)uVar14) {
    do {
      uVar18 = uVar14 >> 1;
      uVar21 = ~uVar18 + uVar14;
      uVar14 = uVar18;
      if (puVar9[uVar18] < (ulong)(long)piVar4[lVar16]) {
        puVar9 = puVar9 + uVar18 + 1;
        uVar14 = uVar21;
      }
    } while (0 < (long)uVar14);
  }
  iVar2 = piVar4[lVar11 + -1];
  if ((0.0 < range_low) || (range_high < 0.0)) {
    if (weights_arr == (double *)0x0) {
      if (sVar15 <= uVar8) {
        pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pdVar6[puVar17[sVar15]] = pdVar6[puVar17[sVar15]] + -1.0;
          sVar15 = sVar15 + 1;
        } while (sVar15 <= uVar8);
      }
    }
    else if (sVar15 <= uVar8) {
      pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar7 = puVar17[sVar15];
        pdVar6[uVar7] = pdVar6[uVar7] - weights_arr[uVar7];
        sVar15 = sVar15 + 1;
      } while (sVar15 <= uVar8);
    }
    if ((puVar9 != puVar12) && (lVar11 != lVar16)) {
      pdVar5 = prediction_data->Xc;
      pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (uVar14 = *puVar9, uVar14 <= (ulong)(long)iVar2) {
        piVar20 = piVar4 + lVar16;
        iVar3 = *piVar20;
        if (iVar3 == (int)uVar14) {
          dVar22 = pdVar5[lVar16];
          if ((NAN(dVar22)) || ((range_low <= dVar22 && (dVar22 <= range_high)))) {
            dVar22 = 1.0;
            if (weights_arr != (double *)0x0) {
              dVar22 = weights_arr[uVar14];
            }
            pdVar6[uVar14] = dVar22 + pdVar6[uVar14];
          }
          if (puVar9 == puVar17 + uVar8) {
            return;
          }
          if (lVar16 == lVar11 + -1) {
            return;
          }
          piVar20 = piVar20 + 1;
          puVar9 = puVar9 + 1;
          uVar14 = (long)piVar4 + (lVar11 * 4 - (long)piVar20) >> 2;
          if (0 < (long)uVar14) {
            do {
              uVar21 = uVar14 >> 1;
              uVar18 = ~uVar21 + uVar14;
              uVar14 = uVar21;
              if ((ulong)(long)piVar20[uVar21] < *puVar9) {
                piVar20 = piVar20 + uVar21 + 1;
                uVar14 = uVar18;
              }
            } while (0 < (long)uVar14);
          }
          lVar16 = (long)piVar20 - (long)piVar4 >> 2;
        }
        else if ((int)uVar14 < iVar3) {
          puVar9 = puVar9 + 1;
          uVar14 = (long)puVar12 - (long)puVar9 >> 3;
          while (0 < (long)uVar14) {
            uVar18 = uVar14 >> 1;
            uVar21 = ~uVar18 + uVar14;
            uVar14 = uVar18;
            if (puVar9[uVar18] < (ulong)(long)iVar3) {
              puVar9 = puVar9 + uVar18 + 1;
              uVar14 = uVar21;
            }
          }
        }
        else {
          piVar19 = piVar20 + 1;
          uVar18 = (long)piVar4 + (lVar11 * 4 - (long)(piVar20 + 1)) >> 2;
          while (0 < (long)uVar18) {
            uVar13 = uVar18 >> 1;
            uVar21 = ~uVar13 + uVar18;
            uVar18 = uVar13;
            if ((ulong)(long)piVar19[uVar13] < uVar14) {
              piVar19 = piVar19 + uVar13 + 1;
              uVar18 = uVar21;
            }
          }
          lVar16 = (long)piVar19 - (long)piVar4 >> 2;
        }
        if (puVar9 == puVar12) {
          return;
        }
        if (lVar16 == lVar11) {
          return;
        }
      }
    }
  }
  else if ((puVar9 != puVar12) && (lVar11 != lVar16)) {
    pdVar5 = prediction_data->Xc;
    pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (uVar14 = *puVar9, uVar14 <= (ulong)(long)iVar2) {
      piVar20 = piVar4 + lVar16;
      iVar3 = *piVar20;
      if (iVar3 == (int)uVar14) {
        dVar22 = pdVar5[lVar16];
        if ((!NAN(dVar22)) && ((dVar22 < range_low || (range_high < dVar22)))) {
          dVar22 = 1.0;
          if (weights_arr != (double *)0x0) {
            dVar22 = weights_arr[uVar14];
          }
          pdVar6[uVar14] = pdVar6[uVar14] - dVar22;
        }
        if (puVar9 == puVar17 + uVar8) {
          return;
        }
        if (lVar16 == lVar11 + -1) {
          return;
        }
        piVar19 = piVar20 + 1;
        puVar9 = puVar9 + 1;
        uVar14 = (long)piVar4 + (lVar11 * 4 - (long)piVar19) >> 2;
        if (0 < (long)uVar14) {
          do {
            uVar21 = uVar14 >> 1;
            uVar18 = ~uVar21 + uVar14;
            uVar14 = uVar21;
            if ((ulong)(long)piVar19[uVar21] < *puVar9) {
              piVar19 = piVar19 + uVar21 + 1;
              uVar14 = uVar18;
            }
          } while (0 < (long)uVar14);
        }
LAB_001ca792:
        lVar16 = (long)piVar19 - (long)piVar4 >> 2;
      }
      else {
        if (iVar3 <= (int)uVar14) {
          piVar19 = piVar20 + 1;
          uVar18 = (long)piVar4 + (lVar11 * 4 - (long)(piVar20 + 1)) >> 2;
          while (0 < (long)uVar18) {
            uVar13 = uVar18 >> 1;
            uVar21 = ~uVar13 + uVar18;
            uVar18 = uVar13;
            if ((ulong)(long)piVar19[uVar13] < uVar14) {
              piVar19 = piVar19 + uVar13 + 1;
              uVar18 = uVar21;
            }
          }
          goto LAB_001ca792;
        }
        puVar9 = puVar9 + 1;
        uVar14 = (long)puVar12 - (long)puVar9 >> 3;
        while (0 < (long)uVar14) {
          uVar18 = uVar14 >> 1;
          uVar21 = ~uVar18 + uVar14;
          uVar14 = uVar18;
          if (puVar9[uVar18] < (ulong)(long)iVar3) {
            puVar9 = puVar9 + uVar18 + 1;
            uVar14 = uVar21;
          }
        }
      }
      if (puVar9 == puVar12) {
        return;
      }
      if (lVar16 == lVar11) {
        return;
      }
    }
  }
  return;
}

Assistant:

void add_csc_range_penalty(WorkerForPredictCSC     &workspace,
                           const PredictionData    &prediction_data,
                           const double *restrict  weights_arr,
                           size_t                  col_num,
                           double                  range_low,
                           double                  range_high)
{
    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    size_t st_col  = prediction_data.Xc_indptr[col_num];
    size_t end_col = prediction_data.Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = prediction_data.Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(workspace.ix_arr.data() + workspace.st,
                                      workspace.ix_arr.data() + workspace.end + 1,
                                      prediction_data.Xc_ind[st_col]);

    if (range_low <= 0 && range_high >= 0)
    {
        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(!std::isnan(prediction_data.Xc[curr_pos])
                               &&
                           (   prediction_data.Xc[curr_pos] < range_low    ||
                               prediction_data.Xc[curr_pos] > range_high   )))
                {
                    workspace.depths[*row] -= (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }

    else
    {
        if (likely(weights_arr == NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]]--;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] -= weights_arr[workspace.ix_arr[row]];


        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(std::isnan(prediction_data.Xc[curr_pos])
                               ||
                           (   prediction_data.Xc[curr_pos] >= range_low    &&
                               prediction_data.Xc[curr_pos] <= range_high   )))
                {
                    workspace.depths[*row] += (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }
}